

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall Catch::CompactReporter::AssertionPrinter::print(AssertionPrinter *this)

{
  OfType OVar1;
  AssertionResult *pAVar2;
  ostream *poVar3;
  long *plVar4;
  size_type *psVar5;
  Code colour;
  _Alloc_hider _Var6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  string local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_38 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_28;
  
  printSourceInfo(this);
  pAVar2 = this->result;
  (this->itMessage)._M_current =
       (this->messages).super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>.
       _M_impl.super__Vector_impl_data._M_start;
  OVar1 = (pAVar2->m_resultData).resultType;
  if (ExpressionFailed < OVar1) {
    if (OVar1 < ThrewException) {
      if (OVar1 == ExplicitFailure) {
        paVar7 = &local_58.field_2;
        local_58._M_dataplus._M_p = (pointer)paVar7;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"failed","");
        printResultType(this,BrightRed,&local_58);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58._M_dataplus._M_p != paVar7) {
          operator_delete(local_58._M_dataplus._M_p);
        }
        local_58._M_dataplus._M_p = (pointer)paVar7;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"explicitly","");
        local_38[0] = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_38[0]._1_7_,0x20);
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>(this->stream,(char *)local_38,1)
        ;
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar3,local_58._M_dataplus._M_p,local_58._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58._M_dataplus._M_p != paVar7) {
          operator_delete(local_58._M_dataplus._M_p);
        }
        goto LAB_00140c92;
      }
      if (OVar1 != Exception) {
        return;
      }
      goto switchD_00140a52_caseD_ffffffff;
    }
    if (OVar1 == ThrewException) {
      paVar7 = &local_58.field_2;
      local_58._M_dataplus._M_p = (pointer)paVar7;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"failed","");
      printResultType(this,BrightRed,&local_58);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != paVar7) {
        operator_delete(local_58._M_dataplus._M_p);
      }
      local_58._M_dataplus._M_p = (pointer)paVar7;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_58,"unexpected exception with message:","");
      local_38[0] = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(local_38[0]._1_7_,0x20);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>(this->stream,(char *)local_38,1);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar3,local_58._M_dataplus._M_p,local_58._M_string_length);
LAB_00140dab:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p);
      }
      printMessage(this);
    }
    else {
      if (OVar1 != DidntThrowException) {
        if (OVar1 != FatalErrorCondition) {
          return;
        }
        paVar7 = &local_58.field_2;
        local_58._M_dataplus._M_p = (pointer)paVar7;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"failed","");
        printResultType(this,BrightRed,&local_58);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58._M_dataplus._M_p != paVar7) {
          operator_delete(local_58._M_dataplus._M_p);
        }
        local_58._M_dataplus._M_p = (pointer)paVar7;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_58,"fatal error condition with message:","");
        local_38[0] = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_38[0]._1_7_,0x20);
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>(this->stream,(char *)local_38,1)
        ;
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar3,local_58._M_dataplus._M_p,local_58._M_string_length);
        goto LAB_00140dab;
      }
      paVar7 = &local_58.field_2;
      local_58._M_dataplus._M_p = (pointer)paVar7;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"failed","");
      printResultType(this,BrightRed,&local_58);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != paVar7) {
        operator_delete(local_58._M_dataplus._M_p);
      }
      local_58._M_dataplus._M_p = (pointer)paVar7;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_58,"expected exception, got none","");
      local_38[0] = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(local_38[0]._1_7_,0x20);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>(this->stream,(char *)local_38,1);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar3,local_58._M_dataplus._M_p,local_58._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != paVar7) {
        operator_delete(local_58._M_dataplus._M_p);
      }
    }
    printExpressionWas(this);
    goto LAB_00140f00;
  }
  switch(OVar1) {
  case Ok:
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"passed","");
    printResultType(this,BrightGreen,&local_58);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p);
    }
    printOriginalExpression(this);
    printReconstructedExpression(this);
    if ((this->result->m_info).capturedExpression._M_string_length != 0) goto LAB_00140f00;
LAB_00140c92:
    colour = None;
    goto LAB_00140f08;
  case Info:
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"info","");
    printResultType(this,None,&local_58);
    goto LAB_00140e28;
  case Warning:
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"warning","");
    printResultType(this,None,&local_58);
LAB_00140e28:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p);
    }
    printMessage(this);
LAB_00140f00:
    colour = FileName;
LAB_00140f08:
    printRemainingMessages(this,colour);
    break;
  default:
    if (OVar1 != FailureBit) {
      if (OVar1 != ExpressionFailed) {
        return;
      }
      if (((pAVar2->m_info).resultDisposition & SuppressFail) == 0) {
        paVar7 = &local_58.field_2;
        local_58._M_dataplus._M_p = (pointer)paVar7;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"failed","");
        printResultType(this,BrightRed,&local_58);
        _Var6._M_p = local_58._M_dataplus._M_p;
      }
      else {
        paVar7 = &local_28;
        local_38[0] = paVar7;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_38," - but was ok","");
        plVar4 = (long *)std::__cxx11::string::replace((ulong)local_38,0,(char *)0x0,0x147f8d);
        psVar5 = (size_type *)(plVar4 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar4 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar5) {
          local_58.field_2._M_allocated_capacity = *psVar5;
          local_58.field_2._8_8_ = plVar4[3];
          local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
        }
        else {
          local_58.field_2._M_allocated_capacity = *psVar5;
          local_58._M_dataplus._M_p = (pointer)*plVar4;
        }
        local_58._M_string_length = plVar4[1];
        *plVar4 = (long)psVar5;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        printResultType(this,BrightGreen,&local_58);
        _Var6._M_p = (pointer)local_38[0];
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58._M_dataplus._M_p != &local_58.field_2) {
          operator_delete(local_58._M_dataplus._M_p);
          _Var6._M_p = (pointer)local_38[0];
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Var6._M_p != paVar7) {
        operator_delete(_Var6._M_p);
      }
      printOriginalExpression(this);
      printReconstructedExpression(this);
      goto LAB_00140f00;
    }
  case Unknown:
switchD_00140a52_caseD_ffffffff:
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"** internal error **","");
    printResultType(this,BrightRed,&local_58);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p);
    }
  }
  return;
}

Assistant:

void print() {
                printSourceInfo();

                itMessage = messages.begin();

                switch( result.getResultType() ) {
                    case ResultWas::Ok:
                        printResultType( Colour::ResultSuccess, passedString() );
                        printOriginalExpression();
                        printReconstructedExpression();
                        if ( ! result.hasExpression() )
                            printRemainingMessages( Colour::None );
                        else
                            printRemainingMessages();
                        break;
                    case ResultWas::ExpressionFailed:
                        if( result.isOk() )
                            printResultType( Colour::ResultSuccess, failedString() + std::string( " - but was ok" ) );
                        else
                            printResultType( Colour::Error, failedString() );
                        printOriginalExpression();
                        printReconstructedExpression();
                        printRemainingMessages();
                        break;
                    case ResultWas::ThrewException:
                        printResultType( Colour::Error, failedString() );
                        printIssue( "unexpected exception with message:" );
                        printMessage();
                        printExpressionWas();
                        printRemainingMessages();
                        break;
                    case ResultWas::FatalErrorCondition:
                        printResultType( Colour::Error, failedString() );
                        printIssue( "fatal error condition with message:" );
                        printMessage();
                        printExpressionWas();
                        printRemainingMessages();
                        break;
                    case ResultWas::DidntThrowException:
                        printResultType( Colour::Error, failedString() );
                        printIssue( "expected exception, got none" );
                        printExpressionWas();
                        printRemainingMessages();
                        break;
                    case ResultWas::Info:
                        printResultType( Colour::None, "info" );
                        printMessage();
                        printRemainingMessages();
                        break;
                    case ResultWas::Warning:
                        printResultType( Colour::None, "warning" );
                        printMessage();
                        printRemainingMessages();
                        break;
                    case ResultWas::ExplicitFailure:
                        printResultType( Colour::Error, failedString() );
                        printIssue( "explicitly" );
                        printRemainingMessages( Colour::None );
                        break;
                    // These cases are here to prevent compiler warnings
                    case ResultWas::Unknown:
                    case ResultWas::FailureBit:
                    case ResultWas::Exception:
                        printResultType( Colour::Error, "** internal error **" );
                        break;
                }
            }